

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_csp_enc.c
# Opt level: O2

int WebPPictureYUVAToARGB(WebPPicture *picture)

{
  uint uVar1;
  int iVar2;
  uint32_t *puVar3;
  int iVar4;
  uint uVar5;
  WebPUpsampleLinePairFunc p_Var6;
  long lVar7;
  long lVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  WebPEncodingError error;
  int iVar11;
  ulong uVar12;
  uint8_t *puVar13;
  uint uVar14;
  uint8_t *puVar15;
  uint8_t *puVar16;
  
  if (picture == (WebPPicture *)0x0) {
    return 0;
  }
  error = VP8_ENC_ERROR_NULL_PARAMETER;
  if ((((picture->y != (uint8_t *)0x0) && (picture->u != (uint8_t *)0x0)) &&
      (picture->v != (uint8_t *)0x0)) &&
     (((picture->colorspace & WEBP_CSP_ALPHA_BIT) == WEBP_YUV420 || (picture->a != (uint8_t *)0x0)))
     ) {
    if ((picture->colorspace & WEBP_CSP_UV_MASK) == WEBP_YUV420) {
      iVar4 = WebPPictureAllocARGB(picture,picture->width,picture->height);
      if (iVar4 == 0) {
        return 0;
      }
      picture->use_argb = 1;
      uVar1 = picture->width;
      uVar14 = picture->height;
      iVar4 = picture->argb_stride;
      puVar3 = picture->argb;
      puVar9 = picture->u;
      puVar15 = picture->v;
      puVar13 = picture->y;
      p_Var6 = WebPGetLinePairConverter(1);
      (*p_Var6)(puVar13,(uint8_t *)0x0,puVar9,puVar15,puVar9,puVar15,(uint8_t *)puVar3,
                (uint8_t *)0x0,uVar1);
      lVar7 = (long)picture->y_stride;
      puVar13 = puVar13 + lVar7;
      lVar8 = (long)(iVar4 * 4);
      puVar10 = (uint8_t *)((long)puVar3 + lVar8);
      iVar4 = iVar4 << 3;
      puVar16 = (uint8_t *)((long)puVar3 + lVar8 * 2);
      for (iVar11 = 2; iVar11 < (int)uVar14; iVar11 = iVar11 + 2) {
        iVar2 = picture->uv_stride;
        (*p_Var6)(puVar13,puVar13 + (int)lVar7,puVar9,puVar15,puVar9 + iVar2,puVar15 + iVar2,puVar10
                  ,puVar16,uVar1);
        lVar7 = (long)picture->y_stride;
        puVar13 = puVar13 + lVar7 * 2;
        puVar10 = puVar10 + iVar4;
        puVar16 = puVar16 + iVar4;
        puVar9 = puVar9 + iVar2;
        puVar15 = puVar15 + iVar2;
      }
      if ((uVar14 & 1) == 0 && 1 < (int)uVar14) {
        (*p_Var6)(puVar13,(uint8_t *)0x0,puVar9,puVar15,puVar9,puVar15,puVar10,(uint8_t *)0x0,uVar1)
        ;
      }
      if ((picture->colorspace & WEBP_CSP_ALPHA_BIT) != WEBP_YUV420) {
        if ((int)uVar1 < 1) {
          uVar1 = 0;
        }
        uVar5 = 0;
        if ((int)uVar14 < 1) {
          uVar14 = 0;
          uVar5 = 0;
        }
        for (; uVar5 != uVar14; uVar5 = uVar5 + 1) {
          iVar4 = picture->a_stride;
          puVar10 = picture->a;
          iVar11 = picture->argb_stride;
          puVar3 = picture->argb;
          for (uVar12 = 0; uVar1 != uVar12; uVar12 = uVar12 + 1) {
            *(uint8_t *)((long)puVar3 + uVar12 * 4 + (long)(int)(iVar11 * uVar5) * 4 + 3) =
                 puVar10[uVar12 + (long)(int)(iVar4 * uVar5)];
          }
        }
      }
      return 1;
    }
    error = VP8_ENC_ERROR_INVALID_CONFIGURATION;
  }
  iVar4 = WebPEncodingSetError(picture,error);
  return iVar4;
}

Assistant:

int WebPPictureYUVAToARGB(WebPPicture* picture) {
  if (picture == NULL) return 0;
  if (picture->y == NULL || picture->u == NULL || picture->v == NULL) {
    return WebPEncodingSetError(picture, VP8_ENC_ERROR_NULL_PARAMETER);
  }
  if ((picture->colorspace & WEBP_CSP_ALPHA_BIT) && picture->a == NULL) {
    return WebPEncodingSetError(picture, VP8_ENC_ERROR_NULL_PARAMETER);
  }
  if ((picture->colorspace & WEBP_CSP_UV_MASK) != WEBP_YUV420) {
    return WebPEncodingSetError(picture, VP8_ENC_ERROR_INVALID_CONFIGURATION);
  }
  // Allocate a new argb buffer (discarding the previous one).
  if (!WebPPictureAllocARGB(picture, picture->width, picture->height)) return 0;
  picture->use_argb = 1;

  // Convert
  {
    int y;
    const int width = picture->width;
    const int height = picture->height;
    const int argb_stride = 4 * picture->argb_stride;
    uint8_t* dst = (uint8_t*)picture->argb;
    const uint8_t* cur_u = picture->u, *cur_v = picture->v, *cur_y = picture->y;
    WebPUpsampleLinePairFunc upsample =
        WebPGetLinePairConverter(ALPHA_OFFSET > 0);

    // First row, with replicated top samples.
    upsample(cur_y, NULL, cur_u, cur_v, cur_u, cur_v, dst, NULL, width);
    cur_y += picture->y_stride;
    dst += argb_stride;
    // Center rows.
    for (y = 1; y + 1 < height; y += 2) {
      const uint8_t* const top_u = cur_u;
      const uint8_t* const top_v = cur_v;
      cur_u += picture->uv_stride;
      cur_v += picture->uv_stride;
      upsample(cur_y, cur_y + picture->y_stride, top_u, top_v, cur_u, cur_v,
               dst, dst + argb_stride, width);
      cur_y += 2 * picture->y_stride;
      dst += 2 * argb_stride;
    }
    // Last row (if needed), with replicated bottom samples.
    if (height > 1 && !(height & 1)) {
      upsample(cur_y, NULL, cur_u, cur_v, cur_u, cur_v, dst, NULL, width);
    }
    // Insert alpha values if needed, in replacement for the default 0xff ones.
    if (picture->colorspace & WEBP_CSP_ALPHA_BIT) {
      for (y = 0; y < height; ++y) {
        uint32_t* const argb_dst = picture->argb + y * picture->argb_stride;
        const uint8_t* const src = picture->a + y * picture->a_stride;
        int x;
        for (x = 0; x < width; ++x) {
          argb_dst[x] = (argb_dst[x] & 0x00ffffffu) | ((uint32_t)src[x] << 24);
        }
      }
    }
  }
  return 1;
}